

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

bool __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
::has_element(raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
              *this,value_type *elem,size_t hashval)

{
  char *pcVar1;
  ulong uVar2;
  slot_type *psVar3;
  proxy *ppVar4;
  proxy *ppVar5;
  baseHolder *pbVar6;
  uint uVar7;
  ushort uVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  int iVar25;
  uint uVar26;
  ulong uVar27;
  byte unaff_BPL;
  ulong uVar28;
  bool bVar29;
  char cVar30;
  byte bVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  __m128i match;
  ulong local_78;
  char local_58;
  char cStack_57;
  char cStack_56;
  char cStack_55;
  
  uVar2 = this->capacity_;
  if ((uVar2 + 1 & uVar2) != 0) {
    __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                  ,0x96,"phmap::priv::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]");
  }
  local_78 = hashval >> 7 & uVar2;
  auVar32 = ZEXT416((CONCAT11((char)hashval,(char)hashval) & 0xff7f) & 0xffff7fff);
  auVar32 = pshuflw(auVar32,auVar32,0);
  uVar27 = 0;
  do {
    pcVar1 = this->ctrl_ + local_78;
    cVar9 = *pcVar1;
    cVar10 = pcVar1[1];
    cVar11 = pcVar1[2];
    cVar12 = pcVar1[3];
    cVar13 = pcVar1[4];
    cVar14 = pcVar1[5];
    cVar15 = pcVar1[6];
    cVar16 = pcVar1[7];
    cVar17 = pcVar1[8];
    cVar18 = pcVar1[9];
    cVar19 = pcVar1[10];
    cVar20 = pcVar1[0xb];
    cVar21 = pcVar1[0xc];
    cVar22 = pcVar1[0xd];
    cVar23 = pcVar1[0xe];
    cVar24 = pcVar1[0xf];
    local_58 = auVar32[0];
    cStack_57 = auVar32[1];
    cStack_56 = auVar32[2];
    cStack_55 = auVar32[3];
    auVar33[0] = -(local_58 == cVar9);
    auVar33[1] = -(cStack_57 == cVar10);
    auVar33[2] = -(cStack_56 == cVar11);
    auVar33[3] = -(cStack_55 == cVar12);
    auVar33[4] = -(local_58 == cVar13);
    auVar33[5] = -(cStack_57 == cVar14);
    auVar33[6] = -(cStack_56 == cVar15);
    auVar33[7] = -(cStack_55 == cVar16);
    auVar33[8] = -(local_58 == cVar17);
    auVar33[9] = -(cStack_57 == cVar18);
    auVar33[10] = -(cStack_56 == cVar19);
    auVar33[0xb] = -(cStack_55 == cVar20);
    auVar33[0xc] = -(local_58 == cVar21);
    auVar33[0xd] = -(cStack_57 == cVar22);
    auVar33[0xe] = -(cStack_56 == cVar23);
    auVar33[0xf] = -(cStack_55 == cVar24);
    uVar8 = (ushort)(SUB161(auVar33 >> 7,0) & 1) | (ushort)(SUB161(auVar33 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar33 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar33 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar33 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar33 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar33 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar33 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar33 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar33 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar33 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar33 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar33 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar33 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar33 >> 0x77,0) & 1) << 0xe | (ushort)(auVar33[0xf] >> 7) << 0xf;
    bVar29 = uVar8 == 0;
    if (!bVar29) {
      uVar26 = (uint)uVar8;
      do {
        uVar7 = 0;
        if (uVar26 != 0) {
          for (; (uVar26 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
          }
        }
        psVar3 = this->slots_;
        uVar28 = uVar7 + local_78 & uVar2;
        ppVar4 = psVar3[uVar28].value.first.mDat;
        ppVar5 = (elem->first).mDat;
        cVar30 = ppVar5 == (proxy *)0x0;
        if (ppVar4 == (proxy *)0x0) {
LAB_0018fbae:
          if (cVar30 == '\0') goto LAB_0018fbf0;
          ppVar4 = (&psVar3->value)[uVar28].second.mDat;
          ppVar5 = (elem->second).mDat;
          bVar31 = ppVar4 == (proxy *)0x0 && ppVar5 == (proxy *)0x0;
          if (ppVar5 != (proxy *)0x0 && ppVar4 != (proxy *)0x0) {
            iVar25 = (*ppVar4->data->_vptr_baseHolder[4])(ppVar4->data,ppVar5->data);
            bVar31 = (byte)iVar25;
          }
        }
        else {
          if (ppVar5 != (proxy *)0x0) {
            pbVar6 = ppVar4->data;
            iVar25 = (*pbVar6->_vptr_baseHolder[4])(pbVar6,ppVar5->data);
            cVar30 = (char)iVar25;
            goto LAB_0018fbae;
          }
LAB_0018fbf0:
          bVar31 = 0;
        }
        unaff_BPL = unaff_BPL | bVar31;
        if (bVar31 != 0) break;
        uVar26 = uVar26 - 1 & uVar26;
        bVar29 = uVar26 == 0;
      } while (!bVar29);
    }
    if (bVar29) {
      auVar34[0] = -(cVar9 == -0x80);
      auVar34[1] = -(cVar10 == -0x80);
      auVar34[2] = -(cVar11 == -0x80);
      auVar34[3] = -(cVar12 == -0x80);
      auVar34[4] = -(cVar13 == -0x80);
      auVar34[5] = -(cVar14 == -0x80);
      auVar34[6] = -(cVar15 == -0x80);
      auVar34[7] = -(cVar16 == -0x80);
      auVar34[8] = -(cVar17 == -0x80);
      auVar34[9] = -(cVar18 == -0x80);
      auVar34[10] = -(cVar19 == -0x80);
      auVar34[0xb] = -(cVar20 == -0x80);
      auVar34[0xc] = -(cVar21 == -0x80);
      auVar34[0xd] = -(cVar22 == -0x80);
      auVar34[0xe] = -(cVar23 == -0x80);
      auVar34[0xf] = -(cVar24 == -0x80);
      if ((((((((((((((((auVar34 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                       (auVar34 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar34 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar34 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar34 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar34 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar34 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar34 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar34 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar34 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar34 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar34 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar34 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar34 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar34 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar34[0xf])
      {
        if (this->capacity_ <= uVar27 + 0x10) {
          __assert_fail("seq.getindex() < capacity_ && \"full table!\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                        ,0x953,
                        "bool phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any, cs_impl::any>, phmap::Hash<cs_impl::any>, phmap::EqualTo<cs_impl::any>, std::allocator<std::pair<const cs_impl::any, cs_impl::any>>>::has_element(const value_type &, size_t) const [Policy = phmap::priv::FlatHashMapPolicy<cs_impl::any, cs_impl::any>, Hash = phmap::Hash<cs_impl::any>, Eq = phmap::EqualTo<cs_impl::any>, Alloc = std::allocator<std::pair<const cs_impl::any, cs_impl::any>>]"
                       );
        }
        local_78 = local_78 + uVar27 + 0x10 & uVar2;
        bVar29 = true;
        uVar27 = uVar27 + 0x10;
      }
      else {
        bVar29 = false;
        unaff_BPL = 0;
      }
    }
    else {
      bVar29 = false;
    }
    if (!bVar29) {
      return (bool)(unaff_BPL & 1);
    }
  } while( true );
}

Assistant:

bool has_element(const value_type& elem, size_t hashval) const
			{
				auto seq = probe(hashval);
				while (true) {
					Group g{ctrl_ + seq.offset()};
					for (uint32_t i : g.Match((h2_t)H2(hashval))) {
						if (PHMAP_PREDICT_TRUE(PolicyTraits::element(slots_ + seq.offset((size_t)i)) ==
						                       elem))
							return true;
					}
					if (PHMAP_PREDICT_TRUE(g.MatchEmpty())) return false;
					seq.next();
					assert(seq.getindex() < capacity_ && "full table!");
				}
				return false;
			}